

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall ModbusSimulationDataGenerator::init_crc16_tab(ModbusSimulationDataGenerator *this)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  for (uVar1 = 0; uVar1 != 0x100; uVar1 = uVar1 + 1) {
    uVar3 = 0;
    iVar2 = 8;
    uVar4 = uVar1 & 0xffffffff;
    while( true ) {
      bVar7 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar7) break;
      uVar6 = (uint)uVar4 ^ uVar3;
      uVar5 = (uVar3 & 0xffff) >> 1;
      uVar3 = uVar5 ^ 0xffffa001;
      if ((uVar6 & 1) == 0) {
        uVar3 = uVar5;
      }
      uVar4 = uVar4 >> 1;
    }
    this->crc_tab16[uVar1] = (U16)uVar3;
  }
  return;
}

Assistant:

void ModbusSimulationDataGenerator::init_crc16_tab( void )
{
    int i, j;
    U16 crc, c;

    for( i = 0; i < 256; i++ )
    {
        crc = 0;
        c = ( U16 )i;

        for( j = 0; j < 8; j++ )
        {
            if( ( crc ^ c ) & 0x0001 )
                crc = ( crc >> 1 ) ^ 0xA001;
            else
                crc = crc >> 1;

            c = c >> 1;
        }

        crc_tab16[ i ] = crc;
    }
}